

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

void SoPlex_setRational(void *soplex)

{
  SoPlex *so;
  bool in_stack_00000047;
  Real in_stack_00000048;
  RealParam in_stack_00000054;
  SoPlexBase<double> *in_stack_00000058;
  bool in_stack_000000af;
  int in_stack_000000b0;
  IntParam in_stack_000000b4;
  SoPlexBase<double> *in_stack_000000b8;
  
  ::soplex::SoPlexBase<double>::setIntParam
            (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000af);
  ::soplex::SoPlexBase<double>::setIntParam
            (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000af);
  ::soplex::SoPlexBase<double>::setIntParam
            (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000af);
  ::soplex::SoPlexBase<double>::setIntParam
            (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000af);
  ::soplex::SoPlexBase<double>::setRealParam
            (in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000047);
  ::soplex::SoPlexBase<double>::setRealParam
            (in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000047);
  return;
}

Assistant:

void SoPlex_setRational(void* soplex)
{
#ifndef SOPLEX_WITH_BOOST
   throw SPxException("Rational functions cannot be used when built without Boost.");
#endif
   /* coverity[unreachable] */
   SoPlex* so = (SoPlex*)(soplex);
   so->setIntParam(SoPlex::READMODE, SoPlex::READMODE_RATIONAL);
   so->setIntParam(SoPlex::SOLVEMODE, SoPlex::SOLVEMODE_RATIONAL);
   so->setIntParam(SoPlex::CHECKMODE, SoPlex::CHECKMODE_RATIONAL);
   so->setIntParam(SoPlex::SYNCMODE, SoPlex::SYNCMODE_AUTO);
   so->setRealParam(SoPlex::FEASTOL, 0.0);
   so->setRealParam(SoPlex::OPTTOL, 0.0);
}